

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O0

void bmcg_sat_solver_print_sop_lit(Gia_Man_t *p,int Lit)

{
  int iVar1;
  Vec_Int_t *p_00;
  int iVar2;
  Gia_Man_t *p_01;
  Gia_Man_t *pNew;
  int local_28;
  int iNode;
  int ObjId;
  int i;
  Vec_Int_t *vCisUsed;
  Gia_Man_t *pGStack_10;
  int Lit_local;
  Gia_Man_t *p_local;
  
  vCisUsed._4_4_ = Lit;
  pGStack_10 = p;
  _ObjId = Vec_IntAlloc(100);
  pNew._4_4_ = Abc_Lit2Var(vCisUsed._4_4_);
  Gia_ManCollectCis(pGStack_10,(int *)((long)&pNew + 4),1,_ObjId);
  Vec_IntSort(_ObjId,0);
  for (iNode = 0; iVar1 = iNode, iVar2 = Vec_IntSize(_ObjId), iVar1 < iVar2; iNode = iNode + 1) {
    local_28 = Vec_IntEntry(_ObjId,iNode);
    p_00 = _ObjId;
    iVar1 = iNode;
    iVar2 = Gia_ManIdToCioId(pGStack_10,local_28);
    Vec_IntWriteEntry(p_00,iVar1,iVar2);
  }
  Vec_IntPrint(_ObjId);
  p_01 = Gia_ManDupConeSupp(pGStack_10,vCisUsed._4_4_,_ObjId);
  Vec_IntFree(_ObjId);
  bmcg_sat_solver_print_sop(p_01);
  Gia_ManStop(p_01);
  printf("\n");
  return;
}

Assistant:

void bmcg_sat_solver_print_sop_lit( Gia_Man_t * p, int Lit )
{
    Vec_Int_t * vCisUsed = Vec_IntAlloc( 100 );
    int i, ObjId, iNode = Abc_Lit2Var( Lit );
    Gia_ManCollectCis( p, &iNode, 1, vCisUsed );
    Vec_IntSort( vCisUsed, 0 );
    Vec_IntForEachEntry( vCisUsed, ObjId, i )
        Vec_IntWriteEntry( vCisUsed, i, Gia_ManIdToCioId(p, ObjId) );
    Vec_IntPrint( vCisUsed );
    Gia_Man_t * pNew = Gia_ManDupConeSupp( p, Lit, vCisUsed );
    Vec_IntFree( vCisUsed );
    bmcg_sat_solver_print_sop( pNew );
    Gia_ManStop( pNew );
    printf( "\n" );
}